

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O2

CompatibilityTestType __thiscall deqp::gls::DrawTestSpec::isCompatibilityTest(DrawTestSpec *this)

{
  uint6 uVar1;
  bool bVar2;
  uint uVar3;
  CompatibilityTestType CVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  byte bVar9;
  AttributeSpec *this_00;
  pointer this_01;
  
  uVar1 = *(uint6 *)(gls::(anonymous_namespace)::getMethodInfo(deqp::gls::DrawTestSpec::DrawMethod)
                     ::infos + (long)(int)this->drawMethod * 6);
  this_01 = (this->attribs).
            super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = ((long)(this->attribs).
                 super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)this_01) / 0x28;
  uVar8 = 0;
  uVar6 = uVar5 & 0xffffffff;
  this_00 = this_01;
  uVar7 = uVar6;
  if ((int)uVar5 < 1) {
    uVar6 = uVar8;
    uVar7 = uVar8;
  }
  while( true ) {
    if (uVar6 == 0) break;
    bVar2 = AttributeSpec::isBufferAligned(this_00);
    uVar8 = (ulong)(byte)((byte)uVar8 | !bVar2);
    this_00 = this_00 + 1;
    uVar6 = uVar6 - 1;
  }
  bVar9 = 0;
  while (bVar2 = uVar7 != 0, uVar7 = uVar7 - 1, bVar2) {
    bVar2 = AttributeSpec::isBufferStrideAligned(this_01);
    bVar9 = bVar9 | !bVar2;
    this_01 = this_01 + 1;
  }
  if (((uVar1 & 1) != 0) && (this->indexStorage == STORAGE_BUFFER)) {
    if ((ulong)this->indexType < 3) {
      uVar3 = *(uint *)(&DAT_01900194 + (ulong)this->indexType * 4);
    }
    else {
      uVar3 = 0xffffffff;
    }
    uVar8 = (ulong)(byte)((byte)uVar8 | (this->indexPointerOffset & uVar3) != 0);
  }
  CVar4 = COMPATIBILITY_UNALIGNED_OFFSET;
  if (uVar8 == 0) {
    CVar4 = (uint)bVar9 * 2;
  }
  return CVar4;
}

Assistant:

DrawTestSpec::CompatibilityTestType DrawTestSpec::isCompatibilityTest (void) const
{
	const MethodInfo methodInfo = getMethodInfo(drawMethod);

	bool bufferAlignmentBad = false;
	bool strideAlignmentBad = false;

	// Attribute buffer alignment
	for (int ndx = 0; ndx < (int)attribs.size(); ++ndx)
		if (!attribs[ndx].isBufferAligned())
			bufferAlignmentBad = true;

	// Attribute stride alignment
	for (int ndx = 0; ndx < (int)attribs.size(); ++ndx)
		if (!attribs[ndx].isBufferStrideAligned())
			strideAlignmentBad = true;

	// Index buffer alignment
	if (methodInfo.indexed)
	{
		if (indexStorage == STORAGE_BUFFER)
		{
			int indexSize = 0;
			if (indexType == INDEXTYPE_BYTE)
				indexSize = 1;
			else if (indexType == INDEXTYPE_SHORT)
				indexSize = 2;
			else if (indexType == INDEXTYPE_INT)
				indexSize = 4;
			else
				DE_ASSERT(DE_FALSE);

			if (indexPointerOffset % indexSize != 0)
				bufferAlignmentBad = true;
		}
	}

	// \note combination bad alignment & stride is treated as bad offset
	if (bufferAlignmentBad)
		return COMPATIBILITY_UNALIGNED_OFFSET;
	else if (strideAlignmentBad)
		return COMPATIBILITY_UNALIGNED_STRIDE;
	else
		return COMPATIBILITY_NONE;
}